

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMfs.c
# Opt level: O2

void Abc_NtkInsertMfs(Abc_Ntk_t *pNtk,Sfm_Ntk_t *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  Abc_Obj_t *pAVar4;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Abc_Obj_t *pFanin;
  word *puTruth;
  int iVar5;
  char *pcVar6;
  Mem_Flex_t *pMan;
  
  iVar5 = pNtk->vObjs->nSize;
  p_00 = Vec_IntAlloc(iVar5);
  p_00->nSize = iVar5;
  memset(p_00->pArray,0,(long)iVar5 << 2);
  for (iVar5 = 0; iVar5 < pNtk->vCis->nSize; iVar5 = iVar5 + 1) {
    pAVar4 = Abc_NtkCi(pNtk,iVar5);
    Vec_IntWriteEntry(p_00,(pAVar4->field_6).iTemp,pAVar4->Id);
  }
  for (iVar5 = 0; iVar1 = pNtk->vObjs->nSize, iVar5 < iVar1; iVar5 = iVar5 + 1) {
    pAVar4 = Abc_NtkObj(pNtk,iVar5);
    if (((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xf) == 7)) &&
       (0 < (pAVar4->field_6).iTemp)) {
      Vec_IntWriteEntry(p_00,(pAVar4->field_6).iTemp,pAVar4->Id);
    }
  }
  for (iVar5 = 0; iVar5 < iVar1; iVar5 = iVar5 + 1) {
    pAVar4 = Abc_NtkObj(pNtk,iVar5);
    if ((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xf) == 7)) {
      iVar1 = Sfm_NodeReadFixed(p,(pAVar4->field_6).iTemp);
      if (iVar1 == 0) {
        Abc_ObjRemoveFanins(pAVar4);
      }
    }
    iVar1 = pNtk->vObjs->nSize;
  }
  p_01 = Vec_IntAlloc(0x10000);
  iVar5 = 0;
  do {
    if (pNtk->vObjs->nSize <= iVar5) {
      Vec_IntFree(p_01);
      Vec_IntFree(p_00);
      return;
    }
    pAVar4 = Abc_NtkObj(pNtk,iVar5);
    if (((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xf) == 7)) &&
       ((pAVar4->field_6).iTemp != 0)) {
      iVar1 = Sfm_NodeReadFixed(p,(pAVar4->field_6).iTemp);
      if (iVar1 == 0) {
        iVar1 = Sfm_NodeReadUsed(p,(pAVar4->field_6).iTemp);
        if (iVar1 == 0) {
          Abc_NtkDeleteObj(pAVar4);
        }
        else {
          p_02 = Sfm_NodeReadFanins(p,(pAVar4->field_6).iTemp);
          for (iVar1 = 0; iVar1 < p_02->nSize; iVar1 = iVar1 + 1) {
            iVar2 = Vec_IntEntry(p_02,iVar1);
            iVar2 = Vec_IntEntry(p_00,iVar2);
            pFanin = Abc_NtkObj(pNtk,iVar2);
            Abc_ObjAddFanin(pAVar4,pFanin);
          }
          puTruth = Sfm_NodeReadTruth(p,(pAVar4->field_6).iTemp);
          if (*puTruth == 0xffffffffffffffff) {
            pMan = (Mem_Flex_t *)pNtk->pManFunc;
            pcVar6 = " 1\n";
LAB_0025951b:
            pcVar6 = Abc_SopRegister(pMan,pcVar6);
            (pAVar4->field_5).pData = pcVar6;
          }
          else {
            if (*puTruth == 0) {
              pMan = (Mem_Flex_t *)pNtk->pManFunc;
              pcVar6 = " 0\n";
              goto LAB_0025951b;
            }
            uVar3 = Kit_TruthIsop((uint *)puTruth,p_02->nSize,p_01,1);
            if (p_02->nSize < 1) {
              __assert_fail("Vec_IntSize(vArray) > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMfs.c"
                            ,0xe4,"void Abc_NtkInsertMfs(Abc_Ntk_t *, Sfm_Ntk_t *)");
            }
            if (1 < uVar3) {
              __assert_fail("RetValue == 0 || RetValue == 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMfs.c"
                            ,0xe5,"void Abc_NtkInsertMfs(Abc_Ntk_t *, Sfm_Ntk_t *)");
            }
            pcVar6 = Abc_SopCreateFromIsop((Mem_Flex_t *)pNtk->pManFunc,p_02->nSize,p_01);
            (pAVar4->field_5).pData = pcVar6;
            if (uVar3 != 0) {
              Abc_SopComplement(pcVar6);
              pcVar6 = (char *)(pAVar4->field_5).pData;
            }
          }
          iVar1 = Abc_SopGetVarNum(pcVar6);
          if (iVar1 != p_02->nSize) {
            __assert_fail("Abc_SopGetVarNum((char *)pNode->pData) == Vec_IntSize(vArray)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMfs.c"
                          ,0xea,"void Abc_NtkInsertMfs(Abc_Ntk_t *, Sfm_Ntk_t *)");
          }
        }
      }
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

void Abc_NtkInsertMfs( Abc_Ntk_t * pNtk, Sfm_Ntk_t * p )
{
    Vec_Int_t * vCover, * vMap, * vArray;
    Abc_Obj_t * pNode;
    word * pTruth;
    int i, k, Fanin;
    // map new IDs into old nodes
    vMap = Vec_IntStart( Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachCi( pNtk, pNode, i )
        Vec_IntWriteEntry( vMap, pNode->iTemp, Abc_ObjId(pNode) );
    Abc_NtkForEachNode( pNtk, pNode, i )
        if ( pNode->iTemp > 0 )
            Vec_IntWriteEntry( vMap, pNode->iTemp, Abc_ObjId(pNode) );
    // remove old fanins
    Abc_NtkForEachNode( pNtk, pNode, i )
        if ( !Sfm_NodeReadFixed(p, pNode->iTemp) )
            Abc_ObjRemoveFanins( pNode );
    // create new fanins
    vCover = Vec_IntAlloc( 1 << 16 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( pNode->iTemp == 0 || Sfm_NodeReadFixed(p, pNode->iTemp) )
            continue;
        if ( !Sfm_NodeReadUsed(p, pNode->iTemp) )
        {
            Abc_NtkDeleteObj( pNode );
            continue;
        }
        // update fanins
        vArray = Sfm_NodeReadFanins( p, pNode->iTemp );
        Vec_IntForEachEntry( vArray, Fanin, k )
            Abc_ObjAddFanin( pNode, Abc_NtkObj(pNtk, Vec_IntEntry(vMap, Fanin)) );
        // update function
        pTruth = Sfm_NodeReadTruth( p, pNode->iTemp );
        if ( pTruth[0] == 0 )
            pNode->pData = Abc_SopRegister( (Mem_Flex_t *)pNtk->pManFunc, " 0\n" );
        else if ( ~pTruth[0] == 0 )
            pNode->pData = Abc_SopRegister( (Mem_Flex_t *)pNtk->pManFunc, " 1\n" );
        else
        {
            int RetValue = Kit_TruthIsop( (unsigned *)pTruth, Vec_IntSize(vArray), vCover, 1 );
            assert( Vec_IntSize(vArray) > 0 );
            assert( RetValue == 0 || RetValue == 1 );
            pNode->pData = Abc_SopCreateFromIsop( (Mem_Flex_t *)pNtk->pManFunc, Vec_IntSize(vArray), vCover );
            if ( RetValue )
                Abc_SopComplement( (char *)pNode->pData );
        }
        assert( Abc_SopGetVarNum((char *)pNode->pData) == Vec_IntSize(vArray) );
    }
    Vec_IntFree( vCover );
    Vec_IntFree( vMap );
}